

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall sf2cute::SoundFont::SoundFont(SoundFont *this)

{
  allocator<char> local_25 [20];
  allocator<char> local_11;
  SoundFont *local_10;
  SoundFont *this_local;
  
  local_10 = this;
  std::
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>::
  vector(&this->presets_);
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::vector(&this->instruments_);
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  vector(&this->samples_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->sound_engine_,"EMU8000",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->bank_name_,"Unnamed",local_25)
  ;
  std::allocator<char>::~allocator(local_25);
  std::__cxx11::string::string((string *)&this->rom_name_);
  SFVersionTag::SFVersionTag(&this->rom_version_);
  this->has_rom_version_ = false;
  std::__cxx11::string::string((string *)&this->creation_date_);
  std::__cxx11::string::string((string *)&this->engineers_);
  std::__cxx11::string::string((string *)&this->product_);
  std::__cxx11::string::string((string *)&this->copyright_);
  std::__cxx11::string::string((string *)&this->comment_);
  std::__cxx11::string::string((string *)&this->software_);
  return;
}

Assistant:

SoundFont::SoundFont() :
    sound_engine_(kDefaultTargetSoundEngine),
    bank_name_(kDefaultBankName),
    has_rom_version_(false) {
}